

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

int adh_init(char *input_file_name,char *output_file_name,FILE **output_file_ptr,
            FILE **input_file_ptr)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  
  iVar1 = init_tree();
  if (iVar1 == 0) {
    map_weight_nodes.length = 0x1eef;
    memset(map_weight_nodes.buckets,0,0xf778);
  }
  pFVar3 = bin_open_read(input_file_name);
  *input_file_ptr = pFVar3;
  uVar2 = 1;
  if (iVar1 == 0 && pFVar3 != (FILE *)0x0) {
    pFVar3 = bin_open_create(output_file_name);
    *output_file_ptr = pFVar3;
    uVar2 = (uint)(pFVar3 == (FILE *)0x0);
  }
  return uVar2;
}

Assistant:

int adh_init(const char input_file_name[], const char output_file_name[],
             FILE **output_file_ptr, FILE **input_file_ptr) {
    int rc = init_tree();
    if(rc == RC_OK) {
        hash_init();
    }

    *input_file_ptr = bin_open_read(input_file_name);
    if ((*input_file_ptr) == NULL) {
        rc = RC_FAIL;
    }

    if(rc == RC_OK) {
        (*output_file_ptr) = bin_open_create(output_file_name);
        if ((*output_file_ptr) == NULL) {
            rc = RC_FAIL;
        }
    }

    return rc;
}